

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O3

function<bool_(unsigned_int)> *
spvOperandCanBeForwardDeclaredFunction
          (function<bool_(unsigned_int)> *__return_storage_ptr__,Op opcode)

{
  int32_t iVar1;
  code *pcVar2;
  code *pcVar3;
  ulong uVar4;
  uint uVar5;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar1 = spvOpcodeGeneratesType(opcode);
  if (iVar1 != 0) {
    pcVar2 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:525:11)>
             ::_M_invoke;
    pcVar3 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:525:11)>
             ::_M_manager;
    goto LAB_0029345b;
  }
  pcVar2 = std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:542:13)>
           ::_M_invoke;
  pcVar3 = std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:542:13)>
           ::_M_manager;
  if ((int)opcode < 0xf9) {
    if ((int)opcode < 0x47) {
      if ((int)opcode < 0x1c) {
        if (opcode - OpName < 2) goto LAB_0029345b;
        uVar5 = opcode - OpEntryPoint;
        goto LAB_002934f8;
      }
      if (opcode == OpTypeArray) {
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:580:13)>
                 ::_M_invoke;
        pcVar3 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:580:13)>
                 ::_M_manager;
        goto LAB_0029345b;
      }
      if (opcode == OpTypeForwardPointer) {
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:577:13)>
                 ::_M_invoke;
        pcVar3 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:577:13)>
                 ::_M_manager;
        goto LAB_0029345b;
      }
      if (opcode == OpFunctionCall) {
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:553:13)>
                 ::_M_invoke;
        pcVar3 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:553:13)>
                 ::_M_manager;
        goto LAB_0029345b;
      }
    }
    else if ((int)opcode < 0xf5) {
      if (opcode - OpDecorate < 2) goto LAB_0029345b;
      if (opcode - OpGroupDecorate < 2) goto LAB_00293569;
    }
    else {
      if (opcode - OpLoopMerge < 2) goto LAB_0029345b;
      if (opcode == OpPhi) {
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:557:13)>
                 ::_M_invoke;
        pcVar3 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:557:13)>
                 ::_M_manager;
        goto LAB_0029345b;
      }
    }
  }
  else if ((int)opcode < 0x125) {
    if (opcode - OpBranchConditional < 2) {
LAB_00293569:
      pcVar2 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:548:13)>
               ::_M_invoke;
      pcVar3 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:548:13)>
               ::_M_manager;
      goto LAB_0029345b;
    }
    if (opcode == OpBranch) goto LAB_0029345b;
    if (opcode == OpEnqueueKernel) {
      pcVar2 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:562:13)>
               ::_M_invoke;
      pcVar3 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:562:13)>
               ::_M_manager;
      goto LAB_0029345b;
    }
  }
  else {
    uVar4 = (ulong)(opcode - OpGetKernelNDrangeSubGroupCount);
    if (opcode - OpGetKernelNDrangeSubGroupCount < 0x28) {
      if ((3UL >> (uVar4 & 0x3f) & 1) != 0) {
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:568:13)>
                 ::_M_invoke;
        pcVar3 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:568:13)>
                 ::_M_manager;
        goto LAB_0029345b;
      }
      if ((0xcUL >> (uVar4 & 0x3f) & 1) != 0) {
        pcVar2 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:574:13)>
                 ::_M_invoke;
        pcVar3 = std::
                 _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:574:13)>
                 ::_M_manager;
        goto LAB_0029345b;
      }
      if ((0xc000000000U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0029345b;
    }
    uVar5 = opcode - OpDecorateString;
LAB_002934f8:
    if (uVar5 < 2) goto LAB_0029345b;
  }
  pcVar2 = std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:583:13)>
           ::_M_invoke;
  pcVar3 = std::
           _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:583:13)>
           ::_M_manager;
LAB_0029345b:
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = pcVar3;
  __return_storage_ptr__->_M_invoker = pcVar2;
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(unsigned)> spvOperandCanBeForwardDeclaredFunction(
    spv::Op opcode) {
  std::function<bool(unsigned index)> out;
  if (spvOpcodeGeneratesType(opcode)) {
    // All types can use forward pointers.
    out = [](unsigned) { return true; };
    return out;
  }
  switch (opcode) {
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
    case spv::Op::OpEntryPoint:
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
    case spv::Op::OpSelectionMerge:
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorateStringGOOGLE:
    case spv::Op::OpBranch:
    case spv::Op::OpLoopMerge:
      out = [](unsigned) { return true; };
      break;
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate:
    case spv::Op::OpBranchConditional:
    case spv::Op::OpSwitch:
      out = [](unsigned index) { return index != 0; };
      break;

    case spv::Op::OpFunctionCall:
      // The Function parameter.
      out = [](unsigned index) { return index == 2; };
      break;

    case spv::Op::OpPhi:
      out = [](unsigned index) { return index > 1; };
      break;

    case spv::Op::OpEnqueueKernel:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 8; };
      break;

    case spv::Op::OpGetKernelNDrangeSubGroupCount:
    case spv::Op::OpGetKernelNDrangeMaxSubGroupSize:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 3; };
      break;

    case spv::Op::OpGetKernelWorkGroupSize:
    case spv::Op::OpGetKernelPreferredWorkGroupSizeMultiple:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 2; };
      break;
    case spv::Op::OpTypeForwardPointer:
      out = [](unsigned index) { return index == 0; };
      break;
    case spv::Op::OpTypeArray:
      out = [](unsigned index) { return index == 1; };
      break;
    default:
      out = [](unsigned) { return false; };
      break;
  }
  return out;
}